

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmarkvalgrind.cpp
# Opt level: O0

qint64 QBenchmarkValgrindUtils::extractResult(QString *fileName)

{
  QByteArrayView bv;
  byte bVar1;
  undefined1 uVar2;
  bool bVar3;
  char *pcVar4;
  qsizetype qVar5;
  longlong *plVar6;
  QString *in_RDI;
  long in_FS_OFFSET;
  __integer_from_chars_result_type<long_long> _Var7;
  char *end;
  char *maybeNumber;
  bool openOk;
  __integer_from_chars_result_type<long_long> r;
  qint64 v;
  QByteArrayView tag;
  QByteArray line;
  QFile file;
  optional<long_long> val;
  longlong *in_stack_fffffffffffffec8;
  enum_type in_stack_fffffffffffffed0;
  enum_type in_stack_fffffffffffffed4;
  QByteArray *in_stack_fffffffffffffed8;
  longlong lVar8;
  undefined4 in_stack_fffffffffffffee0;
  errc in_stack_fffffffffffffee4;
  char *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  undefined6 in_stack_ffffffffffffff00;
  QFile *this;
  char local_b8 [32];
  char *local_98;
  undefined1 *puStack_90;
  undefined1 *local_80;
  undefined8 local_78;
  char *pcStack_70;
  QByteArrayView local_68;
  QByteArray local_50;
  QByteArray local_38;
  undefined1 *local_20;
  _Storage<long_long,_true> local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  this = (QFile *)&local_38;
  QFile::QFile(this,in_RDI);
  operator|(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0);
  QFile::open((QFlags_conflict *)this);
  local_18._M_value = (longlong)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  std::optional<long_long>::optional((optional<long_long> *)&local_18);
  local_50.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_50.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_50.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)0x1ad6ed);
  do {
    do {
      bVar1 = QIODevice::readLineInto(&local_38,(longlong)&local_50);
      if ((bVar1 & 1) == 0) goto LAB_001ad8ad;
      local_68.m_size = 9;
      local_68.m_data = "summary: ";
      local_78 = 9;
      pcStack_70 = "summary: ";
      bv.m_data._0_4_ = in_stack_fffffffffffffef8;
      bv.m_size = (qsizetype)in_stack_fffffffffffffef0;
      bv.m_data._4_4_ = in_stack_fffffffffffffefc;
      uVar2 = QByteArray::startsWith(in_stack_fffffffffffffed8,bv);
    } while (!(bool)uVar2);
    pcVar4 = QByteArray::data((QByteArray *)
                              CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    in_stack_fffffffffffffef8 = SUB84(pcVar4,0);
    in_stack_fffffffffffffefc = (int)((ulong)pcVar4 >> 0x20);
    QByteArrayView::size(&local_68);
    in_stack_fffffffffffffef0 =
         QByteArray::data((QByteArray *)
                          CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    qVar5 = QByteArray::size(&local_50);
    local_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    _Var7 = std::from_chars<long_long>
                      (in_stack_fffffffffffffef0 + qVar5,(char *)this,
                       (longlong *)CONCAT17(bVar1,CONCAT16(uVar2,in_stack_ffffffffffffff00)),
                       in_stack_fffffffffffffefc);
    local_98 = _Var7.ptr;
    in_stack_fffffffffffffee4 = _Var7.ec;
    puStack_90 = (undefined1 *)CONCAT44(puStack_90._4_4_,in_stack_fffffffffffffee4);
  } while (in_stack_fffffffffffffee4 != 0);
  std::optional<long_long>::optional<long_long_&,_true>
            ((optional<long_long> *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffec8);
  local_18 = (_Storage<long_long,_true>)local_38.d.size;
  local_10 = local_20;
LAB_001ad8ad:
  bVar3 = std::optional::operator_cast_to_bool((optional<long_long> *)0x1ad8ba);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               (char *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
               (char *)in_stack_fffffffffffffec8);
    QMessageLogger::fatal(local_b8,"Failed to extract result");
  }
  plVar6 = std::optional<long_long>::operator*((optional<long_long> *)0x1ad8ff);
  lVar8 = *plVar6;
  QByteArray::~QByteArray((QByteArray *)0x1ad914);
  QFile::~QFile((QFile *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return lVar8;
}

Assistant:

qint64 QBenchmarkValgrindUtils::extractResult(const QString &fileName)
{
    QFile file(fileName);
    const bool openOk = file.open(QIODevice::ReadOnly | QIODevice::Text);
    Q_ASSERT(openOk);
    Q_UNUSED(openOk);

    std::optional<qint64> val = std::nullopt;
    QByteArray line;
    while (file.readLineInto(&line)) {
        constexpr QByteArrayView tag = "summary: ";
        if (line.startsWith(tag)) {
            const auto maybeNumber = line.data() + tag.size();
            const auto end = line.data() + line.size();
            qint64 v;
            const auto r = std::from_chars(maybeNumber, end, v);
            if (r.ec == std::errc{}) {
                val = v;
                break;
            }
        }
    }
    if (Q_UNLIKELY(!val))
        qFatal("Failed to extract result");
    return *val;
}